

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

InterfaceHandle __thiscall
helics::CommonCore::getEndpoint(CommonCore *this,LocalFederateId federateID,string_view name)

{
  bool bVar1;
  type puVar2;
  LocalFederateId in_ESI;
  ordered_guarded<helics::HandleManager,_std::shared_mutex> *unaff_retaddr;
  unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_> *ept;
  InterfaceHandle in_stack_fffffffffffffffc;
  
  puVar2 = gmlc::libguarded::ordered_guarded<helics::HandleManager,std::shared_mutex>::
           read<helics::CommonCore::getEndpoint(helics::LocalFederateId,std::basic_string_view<char,std::char_traits<char>>)const::__0>
                     (unaff_retaddr,
                      (anon_class_8_1_898f2789 *)CONCAT44(in_stack_fffffffffffffffc.hid,in_ESI.fid))
  ;
  bVar1 = LocalFederateId::operator!=((LocalFederateId *)(puVar2 + 1),in_ESI);
  if (bVar1) {
    memset(&stack0xfffffffffffffffc,0,4);
    InterfaceHandle::InterfaceHandle((InterfaceHandle *)&stack0xfffffffffffffffc);
  }
  else {
    in_stack_fffffffffffffffc.hid =
         *(BaseType *)
          ((long)&(puVar2->_M_t).
                  super___uniq_ptr_impl<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_helics::BrokerObject_*,_std::default_delete<helics::BrokerObject>_>
                  .super__Head_base<0UL,_helics::BrokerObject_*,_false>._M_head_impl + 4);
  }
  return (InterfaceHandle)in_stack_fffffffffffffffc.hid;
}

Assistant:

InterfaceHandle CommonCore::getEndpoint(LocalFederateId federateID, std::string_view name) const
{
    const auto* ept = handles.read(
        [&name](auto& hand) { return hand.getInterfaceHandle(name, InterfaceType::ENDPOINT); });
    if (ept->local_fed_id != federateID) {
        return {};
    }
    return ept->handle.handle;
}